

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O2

void __thiscall QTimeEdit::QTimeEdit(QTimeEdit *this,QWidget *parent)

{
  long in_FS_OFFSET;
  undefined1 local_50 [12];
  QTime local_44;
  code *local_40 [4];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QTime::QTime(&local_44,0,0,0,0);
  ::QVariant::QVariant((QVariant *)local_40,local_44);
  QDateTimeEdit::QDateTimeEdit(&this->super_QDateTimeEdit,(QVariant *)local_40,QTime,parent);
  ::QVariant::~QVariant((QVariant *)local_40);
  *(undefined ***)&(this->super_QDateTimeEdit).super_QAbstractSpinBox.super_QWidget =
       &PTR_metaObject_007cb068;
  *(undefined ***)
   &(this->super_QDateTimeEdit).super_QAbstractSpinBox.super_QWidget.super_QPaintDevice =
       &PTR__QTimeEdit_007cb258;
  local_40[0] = userTimeChanged;
  local_40[1] = (code *)0x0;
  QObject::connect<void(QDateTimeEdit::*)(QTime),void(QTimeEdit::*)(QTime)>
            ((Object *)local_50,(offset_in_QDateTimeEdit_to_subr)this,
             (ContextType *)QDateTimeEdit::timeChanged,(offset_in_QTimeEdit_to_subr *)0x0,
             (ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTimeEdit::QTimeEdit(QWidget *parent)
    : QDateTimeEdit(QDATETIMEEDIT_TIME_MIN, QMetaType::QTime, parent)
{
    connect(this, &QTimeEdit::timeChanged, this, &QTimeEdit::userTimeChanged);
}